

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O2

void __thiscall
cmCommandArgumentGroup::FollowsGroup(cmCommandArgumentGroup *this,cmCommandArgumentGroup *group)

{
  pointer ppcVar1;
  
  for (ppcVar1 = (this->ContainedArguments).
                 super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar1 !=
      (this->ContainedArguments).
      super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
    cmCommandArgument::FollowsGroup(*ppcVar1,group);
  }
  return;
}

Assistant:

void cmCommandArgumentGroup::FollowsGroup(const cmCommandArgumentGroup* group)
{
  for (std::vector<cmCommandArgument*>::iterator it =
         this->ContainedArguments.begin();
       it != this->ContainedArguments.end(); ++it) {
    (*it)->FollowsGroup(group);
  }
}